

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

NodeBase * __thiscall
SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>::
EditingIterator::UnlinkCurrentNode(EditingIterator *this)

{
  RealCount *pRVar1;
  SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSVar2;
  undefined4 *puVar3;
  code *pcVar4;
  bool bVar5;
  SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
  *pSVar6;
  NodeBase *pNVar7;
  undefined8 *in_FS_OFFSET;
  
  pSVar2 = (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
            *)(this->super_Iterator).current;
  pSVar6 = pSVar2;
  if (pSVar2 == (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
                 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x101,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar5) goto LAB_002a2e52;
    *puVar3 = 0;
    pSVar6 = (SListBase<Memory::Recycler::ObjectBeforeCollectCallbackData,_Memory::ArenaAllocator,_RealCount>
              *)(this->super_Iterator).current;
  }
  if (pSVar6 == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x102,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar5) goto LAB_002a2e52;
    *puVar3 = 0;
  }
  pNVar7 = this->last;
  if (pNVar7 == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x103,"(last != nullptr)","last != nullptr");
    if (!bVar5) {
LAB_002a2e52:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
    pNVar7 = this->last;
  }
  pNVar7->next = ((this->super_Iterator).current)->next;
  pSVar6 = (this->super_Iterator).list;
  (this->super_Iterator).current = this->last;
  this->last = (NodeBase *)0x0;
  pRVar1 = &pSVar6->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return &pSVar2->super_SListNodeBase<Memory::ArenaAllocator>;
}

Assistant:

NodeBase * UnlinkCurrentNode()
        {
            NodeBase * unlinkedNode = const_cast<NodeBase *>(this->current);
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));
            Assert(last != nullptr);

            const_cast<NodeBase *>(last)->Next() = this->current->Next();
            this->current = last;
            last = nullptr;
            const_cast<SListBase *>(this->list)->DecrementCount();
            return unlinkedNode;
        }